

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

void htmlCharDataSAXCallback(htmlParserCtxtPtr ctxt,xmlChar *buf,int size,int mode)

{
  xmlChar xVar1;
  int iVar2;
  ulong uVar3;
  charactersSAXFunc p_Var4;
  cdataBlockSAXFunc UNRECOVERED_JUMPTABLE;
  xmlDtdPtr pxVar5;
  _xmlNode *node;
  ulong uVar6;
  long lVar7;
  
  if (ctxt->sax == (_xmlSAXHandler *)0x0) {
    return;
  }
  if (ctxt->disableSAX != 0) {
    return;
  }
  if ((1 < (uint)mode) &&
     (UNRECOVERED_JUMPTABLE = ctxt->sax->cdataBlock, UNRECOVERED_JUMPTABLE != (cdataBlockSAXFunc)0x0
     )) goto LAB_00165828;
  if ((ctxt->name == (xmlChar *)0x0) ||
     ((iVar2 = xmlStrEqual(ctxt->name,"html"), iVar2 != 0 ||
      (iVar2 = xmlStrEqual(ctxt->name,"head"), iVar2 != 0)))) {
    uVar3 = 0;
    uVar6 = 0;
    if (0 < size) {
      uVar6 = (ulong)(uint)size;
    }
    for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      xVar1 = buf[uVar3];
      if ((xVar1 != ' ') && ((xVar1 == '\v' || ((byte)(xVar1 - 0xe) < 0xfb)))) {
        uVar6 = uVar3 & 0xffffffff;
        break;
      }
    }
    iVar2 = (int)uVar6;
    if (iVar2 != 0) {
      if (ctxt->keepBlanks == 0) {
        p_Var4 = ctxt->sax->ignorableWhitespace;
      }
      else {
        p_Var4 = ctxt->sax->characters;
      }
      if (p_Var4 != (charactersSAXFunc)0x0) {
        (*p_Var4)(ctxt->userData,buf,iVar2);
      }
      buf = buf + uVar6;
      size = size - iVar2;
    }
    if (size < 1) {
      return;
    }
    htmlStartCharData(ctxt);
    if (1 < ctxt->disableSAX) {
      return;
    }
  }
  if ((mode == 0) && (ctxt->keepBlanks == 0)) {
    uVar3 = 0;
    uVar6 = 0;
    if (0 < size) {
      uVar6 = (ulong)(uint)size;
    }
    for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      xVar1 = buf[uVar3];
      if ((xVar1 != ' ') && ((xVar1 == '\v' || ((byte)(xVar1 - 0xe) < 0xfb)))) goto LAB_00165815;
    }
    xVar1 = *ctxt->input->cur;
    if (xVar1 != '\0') {
      if (xVar1 == '<') {
        if ((((ctxt->name == (xmlChar *)0x0) || (iVar2 = xmlStrEqual(ctxt->name,"html"), iVar2 != 0)
             ) || (iVar2 = xmlStrEqual(ctxt->name,"head"), iVar2 != 0)) ||
           ((((iVar2 = xmlStrEqual(ctxt->name,"body"), iVar2 != 0 && (ctxt->myDoc != (xmlDoc *)0x0))
             && ((pxVar5 = xmlGetIntSubset(ctxt->myDoc), pxVar5 != (xmlDtdPtr)0x0 &&
                 (pxVar5->ExternalID != (xmlChar *)0x0)))) &&
            ((iVar2 = xmlStrcasecmp(pxVar5->ExternalID,(xmlChar *)"-//W3C//DTD HTML 4.01//EN"),
             iVar2 == 0 ||
             (iVar2 = xmlStrcasecmp(pxVar5->ExternalID,(xmlChar *)"-//W3C//DTD HTML 4//EN"),
             iVar2 == 0)))))) goto LAB_001658b4;
        if (ctxt->node != (xmlNode *)0x0) {
          for (node = xmlGetLastChild(ctxt->node); node != (xmlNode *)0x0; node = node->prev) {
            if (node->type != XML_COMMENT_NODE) {
              iVar2 = xmlNodeIsText(node);
              if (iVar2 != 0) goto LAB_00165815;
              lVar7 = 0;
              goto LAB_001659aa;
            }
          }
          if ((ctxt->node->type == XML_ELEMENT_NODE) || (ctxt->node->content == (xmlChar *)0x0)) {
            lVar7 = 0;
            do {
              if (lVar7 == 0x1a8) goto LAB_001658b4;
              iVar2 = xmlStrEqual(ctxt->name,*(xmlChar **)((long)allowPCData + lVar7));
              lVar7 = lVar7 + 8;
            } while (iVar2 == 0);
          }
        }
      }
      goto LAB_00165815;
    }
LAB_001658b4:
    UNRECOVERED_JUMPTABLE = ctxt->sax->ignorableWhitespace;
  }
  else {
LAB_00165815:
    UNRECOVERED_JUMPTABLE = ctxt->sax->characters;
  }
  if (UNRECOVERED_JUMPTABLE == (cdataBlockSAXFunc)0x0) {
    return;
  }
LAB_00165828:
  (*UNRECOVERED_JUMPTABLE)(ctxt->userData,buf,size);
  return;
  while( true ) {
    iVar2 = xmlStrEqual(node->name,*(xmlChar **)((long)allowPCData + lVar7));
    lVar7 = lVar7 + 8;
    if (iVar2 != 0) break;
LAB_001659aa:
    if (lVar7 == 0x1a8) goto LAB_001658b4;
  }
  goto LAB_00165815;
}

Assistant:

static void
htmlCharDataSAXCallback(htmlParserCtxtPtr ctxt, const xmlChar *buf,
                        int size, int mode) {
    if ((ctxt->sax == NULL) || (ctxt->disableSAX))
        return;

    if ((mode == 0) || (mode == DATA_RCDATA) ||
        (ctxt->sax->cdataBlock == NULL)) {
        if ((ctxt->name == NULL) ||
            (xmlStrEqual(ctxt->name, BAD_CAST "html")) ||
            (xmlStrEqual(ctxt->name, BAD_CAST "head"))) {
            int i;

            /*
             * Add leading whitespace to html or head elements before
             * calling htmlStartCharData.
             */
            for (i = 0; i < size; i++)
                if (!IS_WS_HTML(buf[i]))
                    break;

            if (i > 0) {
                if (!ctxt->keepBlanks) {
                    if (ctxt->sax->ignorableWhitespace != NULL)
                        ctxt->sax->ignorableWhitespace(ctxt->userData, buf, i);
                } else {
                    if (ctxt->sax->characters != NULL)
                        ctxt->sax->characters(ctxt->userData, buf, i);
                }

                buf += i;
                size -= i;
            }

            if (size <= 0)
                return;

            htmlStartCharData(ctxt);

            if (PARSER_STOPPED(ctxt))
                return;
        }

        if ((mode == 0) &&
            (!ctxt->keepBlanks) &&
            (areBlanks(ctxt, buf, size) > 0)) {
            if (ctxt->sax->ignorableWhitespace != NULL)
                ctxt->sax->ignorableWhitespace(ctxt->userData, buf, size);
        } else {
            if (ctxt->sax->characters != NULL)
                ctxt->sax->characters(ctxt->userData, buf, size);
        }
    } else {
        /*
         * Insert as CDATA, which is the same as HTML_PRESERVE_NODE
         */
        ctxt->sax->cdataBlock(ctxt->userData, buf, size);
    }
}